

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_application_info_link
          (Impl *this,StateCreatorInterface *iface,Value *link)

{
  uint uVar1;
  Type pGVar2;
  Ch *pCVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)link,"application");
  pCVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar2);
  uVar4 = string_to_uint64(pCVar3);
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)link,"tag");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt(pGVar2);
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)link,"hash");
  pCVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar2);
  uVar5 = string_to_uint64(pCVar3);
  (*iface->_vptr_StateCreatorInterface[4])
            (iface,(uVar5 & 0xffffffff ^
                   ((ulong)uVar1 ^
                   ((uVar4 & 0xffffffff ^ 0xaf63bd4c8601b7df) * 0x100000001b3 ^ uVar4 >> 0x20) *
                   0x100000001b3) * 0x100000001b3) * 0x100000001b3 ^ uVar5 >> 0x20,uVar4,
             (ulong)uVar1,uVar5);
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_application_info_link(StateCreatorInterface &iface, const Value &link)
{
	Hash application_hash = string_to_uint64(link["application"].GetString());
	auto tag = static_cast<ResourceTag>(link["tag"].GetInt());
	Hash hash = string_to_uint64(link["hash"].GetString());
	Hash link_hash = Hashing::compute_hash_application_info_link(application_hash, tag, hash);
	iface.notify_application_info_link(link_hash, application_hash, tag, hash);
	return true;
}